

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O0

size_t anon_unknown.dwarf_e925f::getValue(string *filename)

{
  ulong uVar1;
  size_t val;
  string str;
  string *in_stack_00000208;
  size_t *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  unsigned_long local_30;
  string local_28 [40];
  
  getString(in_stack_00000208);
  local_30 = 0;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_30 = std::__cxx11::stoul(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
  }
  std::__cxx11::string::~string(local_28);
  return local_30;
}

Assistant:

size_t getValue(const string& filename)
{
  string str = getString(filename);
  size_t val = 0;

  if (!str.empty())
    val = stoul(str);

  return val;
}